

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBAffineRow_C(uint8_t *src_argb,int src_argb_stride,uint8_t *dst_argb,float *uv_dudv,
                    int width)

{
  ulong uVar1;
  ulong uVar2;
  float fVar4;
  undefined8 uVar3;
  
  uVar3 = *(undefined8 *)uv_dudv;
  uVar1 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = uVar1;
  }
  for (; (int)uVar2 != (int)uVar1; uVar1 = uVar1 + 1) {
    fVar4 = (float)((ulong)uVar3 >> 0x20);
    *(undefined4 *)(dst_argb + uVar1 * 4) =
         *(undefined4 *)
          (src_argb + (long)(int)(float)uVar3 * 4 + (long)((int)fVar4 * src_argb_stride));
    uVar3 = CONCAT44(fVar4 + (float)((ulong)*(undefined8 *)(uv_dudv + 2) >> 0x20),
                     (float)uVar3 + (float)*(undefined8 *)(uv_dudv + 2));
  }
  return;
}

Assistant:

LIBYUV_API
void ARGBAffineRow_C(const uint8_t* src_argb,
                     int src_argb_stride,
                     uint8_t* dst_argb,
                     const float* uv_dudv,
                     int width) {
  int i;
  // Render a row of pixels from source into a buffer.
  float uv[2];
  uv[0] = uv_dudv[0];
  uv[1] = uv_dudv[1];
  for (i = 0; i < width; ++i) {
    int x = (int)(uv[0]);
    int y = (int)(uv[1]);
    *(uint32_t*)(dst_argb) =
        *(const uint32_t*)(src_argb + y * src_argb_stride + x * 4);
    dst_argb += 4;
    uv[0] += uv_dudv[2];
    uv[1] += uv_dudv[3];
  }
}